

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O0

MPP_RET mpp_enc_ref_cfg_check(MppEncRefCfg ref)

{
  MPP_RET MVar1;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  MppEncRefs pvStack_98;
  MPP_RET ret;
  MppEncRefs refs;
  MppEncCpbInfo *cpb_info;
  int local_80;
  RK_U32 tid_mask;
  RK_S32 temporal_id_1;
  MppEncRefMode ref_mode_1;
  MppEncRefStFrmCfg *cfg_1;
  uint local_68;
  RK_S32 pos_1;
  RK_U32 lt_idx_mask;
  RK_S32 lt_idx;
  RK_S32 temporal_id;
  MppEncRefMode ref_mode;
  MppEncRefLtFrmCfg *cfg;
  RK_S32 pos;
  RK_S32 ready;
  RK_S32 st_dryrun_length;
  RK_S32 st_tid_used_mask;
  RK_S32 max_st_tid;
  RK_S32 max_st_ref_cnt;
  RK_S32 lt_dryrun_length;
  RK_S32 lt_idx_used_mask;
  RK_S32 max_lt_ref_idx;
  RK_S32 max_lt_ref_cnt;
  RK_S32 st_cfg_cnt;
  RK_S32 lt_cfg_cnt;
  MppEncRefCfgImpl *p;
  MppEncRefCfg ref_local;
  
  p = (MppEncRefCfgImpl *)ref;
  MVar1 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_check",ref);
  if (MVar1 == MPP_OK) {
    _st_cfg_cnt = p;
    max_lt_ref_cnt = p->lt_cfg_cnt;
    max_lt_ref_idx = p->st_cfg_cnt;
    lt_idx_used_mask = 0;
    lt_dryrun_length = 0;
    max_st_ref_cnt = 0;
    max_st_tid = 0;
    st_tid_used_mask = 0;
    st_dryrun_length = 0;
    ready = 0;
    pos = 0;
    cfg._4_4_ = 1;
    if (max_lt_ref_cnt != 0) {
      _temporal_id = p->lt_cfg;
      for (cfg._0_4_ = 0; (int)(uint)cfg < max_lt_ref_cnt; cfg._0_4_ = (uint)cfg + 1) {
        lt_idx = _temporal_id->ref_mode;
        lt_idx_mask = _temporal_id->temporal_id;
        pos_1 = _temporal_id->lt_idx;
        local_68 = 1 << ((byte)pos_1 & 0x1f);
        if (0xf < pos_1) {
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p lt cfg %d with invalid lt_idx %d larger than MPP_ENC_MAX_LT_REF_NUM\n"
                     ,"mpp_enc_ref_cfg_check",p,(ulong)(uint)cfg,pos_1);
          cfg._4_4_ = 0;
        }
        if ((max_st_ref_cnt & local_68) != 0) {
          _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with redefined lt_idx %d config\n",
                     "mpp_enc_ref_cfg_check",p,(ulong)(uint)cfg,pos_1);
          cfg._4_4_ = 0;
        }
        if ((max_st_ref_cnt & local_68) == 0) {
          max_st_ref_cnt = local_68 | max_st_ref_cnt;
          lt_idx_used_mask = lt_idx_used_mask + 1;
        }
        if (lt_dryrun_length < pos_1) {
          lt_dryrun_length = pos_1;
        }
        if (lt_idx_mask != 0) {
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p lt cfg %d with invalid temporal_id %d is non-zero\n",
                     "mpp_enc_ref_cfg_check",p,(ulong)(uint)cfg,lt_idx_mask);
          cfg._4_4_ = 0;
        }
        if (((lt_idx < 0) || (6 < lt_idx)) && ((lt_idx < 0x19 || (0x19 < lt_idx)))) {
          _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with invalid ref mode %x\n",
                     "mpp_enc_ref_cfg_check",p,(ulong)(uint)cfg,lt_idx);
          cfg._4_4_ = 0;
        }
        if (cfg._4_4_ == 0) break;
        if ((_temporal_id->lt_gap != 0) &&
           (max_st_tid < _temporal_id->lt_gap + _temporal_id->lt_delay)) {
          max_st_tid = _temporal_id->lt_gap + _temporal_id->lt_delay;
        }
        _temporal_id = _temporal_id + 1;
      }
    }
    if ((cfg._4_4_ != 0) && (max_lt_ref_idx != 0)) {
      _temporal_id_1 = _st_cfg_cnt->st_cfg;
      for (cfg_1._4_4_ = 0; (int)cfg_1._4_4_ < max_lt_ref_idx; cfg_1._4_4_ = cfg_1._4_4_ + 1) {
        tid_mask = _temporal_id_1->ref_mode;
        local_80 = _temporal_id_1->temporal_id;
        cpb_info._4_4_ = 1 << ((byte)local_80 & 0x1f);
        if (3 < local_80) {
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p st cfg %d with invalid temporal_id %d larger than MPP_ENC_MAX_TEMPORAL_LAYER_NUM\n"
                     ,"mpp_enc_ref_cfg_check",p,(ulong)cfg_1._4_4_,local_80);
          cfg._4_4_ = 0;
        }
        if ((((int)tid_mask < 0) || (6 < (int)tid_mask)) &&
           (((int)tid_mask < 0x1d || (0x1d < (int)tid_mask)))) {
          _mpp_log_l(2,"mpp_enc_ref","ref cfg %p st cfg %d with invalid ref mode %x\n",
                     "mpp_enc_ref_cfg_check",p,(ulong)cfg_1._4_4_,tid_mask);
          cfg._4_4_ = 0;
        }
        if (_temporal_id_1->repeat < 0) {
          _mpp_log_l(2,"mpp_enc_ref","ref cfg %p st cfg %d with negative repeat %d set to zero\n",
                     "mpp_enc_ref_cfg_check",p,(ulong)cfg_1._4_4_,_temporal_id_1->repeat);
          _temporal_id_1->repeat = 0;
        }
        if ((cfg_1._4_4_ == 0) || (cfg_1._4_4_ == max_lt_ref_idx - 1U)) {
          if (_temporal_id_1->is_non_ref != 0) {
            _mpp_log_l(2,"mpp_enc_ref",
                       "ref cfg %p st cfg %d with invalid non-ref frame on head/tail frame\n",
                       "mpp_enc_ref_cfg_check",p,(ulong)cfg_1._4_4_);
            cfg._4_4_ = 0;
          }
          if (0 < local_80) {
            _mpp_log_l(2,"mpp_enc_ref",
                       "ref cfg %p st cfg %d with invalid non-zero temporal id %d on head/tail frame\n"
                       ,"mpp_enc_ref_cfg_check",p,(ulong)cfg_1._4_4_,local_80);
            cfg._4_4_ = 0;
          }
        }
        if (cfg._4_4_ == 0) break;
        if ((_temporal_id_1->is_non_ref == 0) && ((ready & cpb_info._4_4_) == 0)) {
          st_tid_used_mask = st_tid_used_mask + 1;
          ready = cpb_info._4_4_ | ready;
        }
        if (st_dryrun_length < local_80) {
          st_dryrun_length = local_80;
        }
        pos = _temporal_id_1->repeat + pos + 1;
        _temporal_id_1 = _temporal_id_1 + 1;
      }
    }
    if (cfg._4_4_ == 0) {
      _mpp_log_l(2,"mpp_enc_ref","check ref cfg %p failed\n","mpp_enc_ref_cfg_check",p);
    }
    else {
      refs = &_st_cfg_cnt->cpb_info;
      pvStack_98 = (MppEncRefs)0x0;
      ((MppEncCpbInfo *)refs)->dpb_size = 0;
      (_st_cfg_cnt->cpb_info).max_lt_cnt = lt_idx_used_mask;
      (_st_cfg_cnt->cpb_info).max_st_cnt = st_tid_used_mask;
      (_st_cfg_cnt->cpb_info).max_lt_idx = lt_dryrun_length;
      (_st_cfg_cnt->cpb_info).max_st_tid = st_dryrun_length;
      (_st_cfg_cnt->cpb_info).lt_gop = max_st_tid;
      (_st_cfg_cnt->cpb_info).st_gop = pos + -1;
      MVar1 = mpp_enc_refs_init(&stack0xffffffffffffff68);
      if (MVar1 == MPP_OK) {
        local_a0 = cfg._4_4_;
      }
      else {
        local_a0 = 0;
      }
      cfg._4_4_ = local_a0;
      MVar1 = mpp_enc_refs_set_cfg(pvStack_98,p);
      if (MVar1 == MPP_OK) {
        local_a4 = cfg._4_4_;
      }
      else {
        local_a4 = 0;
      }
      cfg._4_4_ = local_a4;
      MVar1 = mpp_enc_refs_dryrun(pvStack_98);
      if (MVar1 == MPP_OK) {
        local_a8 = cfg._4_4_;
      }
      else {
        local_a8 = 0;
      }
      cfg._4_4_ = local_a8;
      MVar1 = mpp_enc_refs_get_cpb_info(pvStack_98,(MppEncCpbInfo *)refs);
      if (MVar1 == MPP_OK) {
        local_ac = cfg._4_4_;
      }
      else {
        local_ac = 0;
      }
      cfg._4_4_ = local_ac;
      MVar1 = mpp_enc_refs_deinit(&stack0xffffffffffffff68);
      if (MVar1 == MPP_OK) {
        local_b0 = cfg._4_4_;
      }
      else {
        local_b0 = 0;
      }
      cfg._4_4_ = local_b0;
    }
    _st_cfg_cnt->ready = cfg._4_4_;
    ref_local._4_4_ = MPP_NOK;
    if (cfg._4_4_ != 0) {
      ref_local._4_4_ = MPP_OK;
    }
  }
  else {
    ref_local._4_4_ = MPP_ERR_VALUE;
  }
  return ref_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_check(MppEncRefCfg ref)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_VALUE;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;
    RK_S32 lt_cfg_cnt = p->lt_cfg_cnt;
    RK_S32 st_cfg_cnt = p->st_cfg_cnt;
    RK_S32 max_lt_ref_cnt   = 0;
    RK_S32 max_lt_ref_idx   = 0;
    RK_S32 lt_idx_used_mask = 0;
    RK_S32 lt_dryrun_length = 0;
    RK_S32 max_st_ref_cnt   = 0;
    RK_S32 max_st_tid       = 0;
    RK_S32 st_tid_used_mask = 0;
    RK_S32 st_dryrun_length = 0;
    RK_S32 ready = 1;

    /* parse and check gop config for encoder */
    if (lt_cfg_cnt) {
        RK_S32 pos = 0;
        MppEncRefLtFrmCfg *cfg = p->lt_cfg;

        for (pos = 0; pos < lt_cfg_cnt; pos++, cfg++) {
            MppEncRefMode ref_mode = cfg->ref_mode;
            RK_S32 temporal_id = cfg->temporal_id;
            RK_S32 lt_idx = cfg->lt_idx;
            RK_U32 lt_idx_mask = 1 << lt_idx;

            /* check lt idx */
            if (lt_idx >= MPP_ENC_MAX_LT_REF_NUM) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid lt_idx %d larger than MPP_ENC_MAX_LT_REF_NUM\n",
                          ref, pos, lt_idx);
                ready = 0;
            }

            if (lt_idx_used_mask & lt_idx_mask) {
                mpp_err_f("ref cfg %p lt cfg %d with redefined lt_idx %d config\n",
                          ref, pos, lt_idx);
                ready = 0;
            }

            if (!(lt_idx_used_mask & lt_idx_mask)) {
                lt_idx_used_mask |= lt_idx_mask;
                max_lt_ref_cnt++;
            }

            if (lt_idx > max_lt_ref_idx)
                max_lt_ref_idx = lt_idx;

            /* check temporal id */
            if (temporal_id != 0) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid temporal_id %d is non-zero\n",
                          ref, pos, temporal_id);
                ready = 0;
            }

            /* check gop mode */
            if (!REF_MODE_IS_GLOBAL(ref_mode) && !REF_MODE_IS_LT_MODE(ref_mode)) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid ref mode %x\n",
                          ref, pos, ref_mode);
                ready = 0;
            }

            /* if check failed just quit */
            if (!ready)
                break;

            if (cfg->lt_gap && (cfg->lt_gap + cfg->lt_delay > lt_dryrun_length))
                lt_dryrun_length = cfg->lt_gap + cfg->lt_delay;
        }
    }

    /* check st-ref config */
    if (ready && st_cfg_cnt) {
        RK_S32 pos = 0;
        MppEncRefStFrmCfg *cfg = p->st_cfg;

        for (pos = 0; pos < st_cfg_cnt; pos++, cfg++) {
            MppEncRefMode ref_mode = cfg->ref_mode;
            RK_S32 temporal_id = cfg->temporal_id;
            RK_U32 tid_mask = 1 << temporal_id;

            /* check temporal_id */
            if (temporal_id > MPP_ENC_MAX_TEMPORAL_LAYER_NUM - 1) {
                mpp_err_f("ref cfg %p st cfg %d with invalid temporal_id %d larger than MPP_ENC_MAX_TEMPORAL_LAYER_NUM\n",
                          ref, pos, temporal_id);
                ready = 0;
            }

            /* check gop mode */
            if (!REF_MODE_IS_GLOBAL(ref_mode) && !REF_MODE_IS_ST_MODE(ref_mode)) {
                mpp_err_f("ref cfg %p st cfg %d with invalid ref mode %x\n",
                          ref, pos, ref_mode);
                ready = 0;
            }

            if (cfg->repeat < 0) {
                mpp_err_f("ref cfg %p st cfg %d with negative repeat %d set to zero\n",
                          ref, pos, cfg->repeat);
                cfg->repeat = 0;
            }

            /* constrain on head and tail frame */
            if (pos == 0 || (pos == st_cfg_cnt - 1)) {
                if (cfg->is_non_ref) {
                    mpp_err_f("ref cfg %p st cfg %d with invalid non-ref frame on head/tail frame\n",
                              ref, pos);
                    ready = 0;
                }

                if (temporal_id > 0) {
                    mpp_err_f("ref cfg %p st cfg %d with invalid non-zero temporal id %d on head/tail frame\n",
                              ref, pos, temporal_id);
                    ready = 0;
                }
            }

            if (!ready)
                break;

            if (!cfg->is_non_ref && !(st_tid_used_mask & tid_mask)) {
                max_st_ref_cnt++;
                st_tid_used_mask |= tid_mask;
            }

            if (temporal_id > max_st_tid)
                max_st_tid = temporal_id;

            st_dryrun_length++;
            st_dryrun_length += cfg->repeat;
        }
    }

    if (ready) {
        MppEncCpbInfo *cpb_info = &p->cpb_info;
        MppEncRefs refs = NULL;
        MPP_RET ret = MPP_OK;

        cpb_info->dpb_size = 0;
        cpb_info->max_lt_cnt = max_lt_ref_cnt;
        cpb_info->max_st_cnt = max_st_ref_cnt;
        cpb_info->max_lt_idx = max_lt_ref_idx;
        cpb_info->max_st_tid = max_st_tid;
        cpb_info->lt_gop     = lt_dryrun_length;
        cpb_info->st_gop     = st_dryrun_length - 1;

        ret = mpp_enc_refs_init(&refs);
        ready = (ret) ? 0 : (ready);
        ret = mpp_enc_refs_set_cfg(refs, ref);
        ready = (ret) ? 0 : (ready);
        ret = mpp_enc_refs_dryrun(refs);
        ready = (ret) ? 0 : (ready);

        /* update dpb size */
        ret = mpp_enc_refs_get_cpb_info(refs, cpb_info);
        ready = (ret) ? 0 : (ready);

        ret = mpp_enc_refs_deinit(&refs);
        ready = (ret) ? 0 : (ready);
    } else {
        mpp_err_f("check ref cfg %p failed\n", ref);
    }
    p->ready = ready;

    return ready ? MPP_OK : MPP_NOK;
}